

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowTabBar::mouseMoveEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  uint uVar4;
  Int IVar5;
  QObjectData *this_00;
  QObjectPrivate *this_01;
  QDockWidgetPrivate *this_02;
  QObjectPrivate *pQVar6;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar7;
  QDockWidgetPrivate *dockPriv_1;
  QDockWidgetLayout *dwlayout;
  QDockWidgetPrivate *dockPriv;
  int offset;
  QTabBarPrivate *d;
  QRect r;
  undefined4 in_stack_ffffffffffffff18;
  DockOption in_stack_ffffffffffffff1c;
  QPoint *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 uVar8;
  QRect *in_stack_ffffffffffffff40;
  QMainWindowTabBar *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  QRect *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  QPoint mouse;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_6c;
  QRect local_68;
  QPoint local_58;
  undefined8 local_50;
  QPointF local_48;
  QPoint local_38;
  QRect local_30;
  undefined1 local_20 [16];
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_10;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::data
                      ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
                       &(in_RDI->super_QWidgetPrivate).field_0x8);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidget> *)0x5f776c);
  uVar8 = false;
  if (!bVar1) {
    local_10.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QMainWindow::dockOptions((QMainWindow *)in_stack_ffffffffffffff20);
    local_c.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QFlags<QMainWindow::DockOption>::operator&
                   ((QFlags<QMainWindow::DockOption> *)in_stack_ffffffffffffff20,
                    in_stack_ffffffffffffff1c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    uVar8 = IVar2 != 0;
  }
  if ((bool)uVar8 != false) {
    iVar3 = QApplication::startDragDistance();
    in_stack_ffffffffffffff64 = (iVar3 + 1) * 3;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = QWidget::rect((QWidget *)CONCAT17(uVar8,in_stack_ffffffffffffff38));
    local_20 = (undefined1  [16])
               QRect::adjusted(in_stack_ffffffffffffff58,
                               (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                               (int)in_stack_ffffffffffffff50,
                               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                               (int)in_stack_ffffffffffffff48);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c & 0xffffff;
    if ((*(ushort *)(this_00 + 0x2d0) >> 9 & 1) != 0) {
      local_48 = QSinglePointEvent::position((QSinglePointEvent *)0x5f7875);
      local_38 = QPointF::toPoint((QPointF *)in_RDI);
      uVar4 = QRect::contains((QPoint *)local_20,SUB81(&local_38,0));
      in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c & 0xffffff;
      if ((uVar4 & 1) == 0) {
        bVar1 = QTabBarPrivate::validIndex(in_RDI,in_stack_ffffffffffffff2c);
        in_stack_ffffffffffffff2c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
      }
    }
    if ((char)(in_stack_ffffffffffffff2c >> 0x18) != '\0') {
      dockAt(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      QPointer<QDockWidget>::operator=
                ((QPointer<QDockWidget> *)in_stack_ffffffffffffff20,
                 (QDockWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidget> *)0x5f791a);
      if (bVar1) {
        QTabBarPrivate::moveTabFinished
                  ((QTabBarPrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   iVar3);
        *(undefined4 *)(this_00 + 0x2c0) = 0xffffffff;
        if (*(long *)(this_00 + 0x298) != 0) {
          (**(code **)(**(long **)(this_00 + 0x298) + 0x68))(*(long **)(this_00 + 0x298),0);
        }
        QPoint::QPoint(in_stack_ffffffffffffff20);
        *(undefined8 *)(this_00 + 0x264) = local_50;
        ::QPointer::operator_cast_to_QDockWidget_((QPointer<QDockWidget> *)0x5f7999);
        this_01 = QObjectPrivate::get((QObject *)0x5f79a1);
        QPointer<QDockWidget>::operator->((QPointer<QDockWidget> *)0x5f79b4);
        this_02 = (QDockWidgetPrivate *)QWidget::layout((QWidget *)0x5f79bc);
        pQVar6 = this_01;
        local_68 = QDockWidgetLayout::titleArea
                             ((QDockWidgetLayout *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        local_58 = QRect::center(in_stack_ffffffffffffff40);
        QDockWidgetPrivate::initDrag
                  (this_02,(QPoint *)in_stack_ffffffffffffff48,
                   SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
        QDockWidgetPrivate::startDrag
                  ((QDockWidgetPrivate *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (DragScope)((ulong)pQVar6 >> 0x20));
        if (*(long *)(pQVar6 + 600) != 0) {
          QInputEvent::modifiers((QInputEvent *)this_01);
          local_6c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
               (QFlagsStorage<Qt::KeyboardModifier>)
               QFlags<Qt::KeyboardModifier>::operator&
                         ((QFlags<Qt::KeyboardModifier> *)this_01,in_stack_ffffffffffffff1c);
          IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
          *(bool *)(*(long *)(pQVar6 + 600) + 0x2a) = IVar5 != 0;
        }
      }
    }
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidget> *)0x5f7a86);
  if (bVar1) {
    ::QPointer::operator_cast_to_QDockWidget_((QPointer<QDockWidget> *)0x5f7a9a);
    pQVar6 = QObjectPrivate::get((QObject *)0x5f7aa2);
    if ((*(long *)(pQVar6 + 600) != 0) && ((*(byte *)(*(long *)(pQVar6 + 600) + 0x18) & 1) != 0)) {
      QVar7 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x5f7ad2);
      mouse = (QPoint)QVar7.yp;
      QPointF::toPoint((QPointF *)in_RDI);
      ::QPointer::operator_cast_to_QDockWidget_((QPointer<QDockWidget> *)0x5f7afb);
      moveToUnplugPosition(mouse,(QDockWidget *)pQVar6);
    }
  }
  QTabBar::mouseMoveEvent
            ((QTabBar *)this_00,
             (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowTabBar::mouseMoveEvent(QMouseEvent *e)
{
    // The QTabBar handles the moving (reordering) of tabs.
    // When QTabBarPrivate::dragInProgress is true, and that the mouse is outside of a region
    // around the QTabBar, we will consider the user wants to drag that QDockWidget away from this
    // tab area.

    QTabBarPrivate *d = static_cast<QTabBarPrivate*>(d_ptr.data());
    if (!draggingDock && (mainWindow->dockOptions() & QMainWindow::GroupedDragging)) {
        int offset = QApplication::startDragDistance() + 1;
        offset *= 3;
        QRect r = rect().adjusted(-offset, -offset, offset, offset);
        if (d->dragInProgress && !r.contains(e->position().toPoint()) && d->validIndex(d->pressedIndex)) {
            draggingDock = dockAt(d->pressedIndex);
            if (draggingDock) {
                // We should drag this QDockWidget away by unpluging it.
                // First cancel the QTabBar's internal move
                d->moveTabFinished(d->pressedIndex);
                d->pressedIndex = -1;
                if (d->movingTab)
                    d->movingTab->setVisible(false);
                d->dragStartPosition = QPoint();

                // Then starts the drag using QDockWidgetPrivate's API
                QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
                QDockWidgetLayout *dwlayout = static_cast<QDockWidgetLayout *>(draggingDock->layout());
                dockPriv->initDrag(dwlayout->titleArea().center(), true);
                dockPriv->startDrag(QDockWidgetPrivate::DragScope::Widget);
                if (dockPriv->state)
                    dockPriv->state->ctrlDrag = e->modifiers() & Qt::ControlModifier;
            }
        }
    }

    if (draggingDock) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging) {
            // move will call QMainWindowLayout::hover
            moveToUnplugPosition(e->globalPosition().toPoint(), draggingDock);
        }
    }
    QTabBar::mouseMoveEvent(e);
}